

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O2

void test_font_variety(wins *wins_ar,int ar_len,Am_Style *bs,bool invert)

{
  Am_Font_Family_Flag AVar1;
  Am_Font_Size_Flag AVar2;
  Am_Drawonable *font_win;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Am_Font local_58 [8];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  Am_Style *local_38;
  
  test_string = "Egypt";
  test_str_len = 5;
  uVar9 = 0;
  local_50 = (ulong)(uint)ar_len;
  if (ar_len < 1) {
    local_50 = uVar9;
  }
  lVar7 = local_50 * 0x40;
  iVar6 = 0;
  local_38 = bs;
  for (; uVar9 != 3; uVar9 = uVar9 + 1) {
    AVar1 = test_font_variety::family_array[uVar9];
    local_48 = uVar9;
    for (uVar4 = 1; uVar4 < 4; uVar4 = uVar4 + 2) {
      AVar2 = test_font_variety::size_array[uVar4];
      local_40 = uVar4;
      for (iVar3 = 0; iVar3 != 2; iVar3 = iVar3 + 1) {
        iVar5 = 0;
        while( true ) {
          if (iVar5 == 2) break;
          Am_Font::Am_Font(local_58,AVar1,false,iVar3 != 0,iVar5 != 0,AVar2);
          Am_Font::operator=((Am_Font *)&test_font,local_58);
          Am_Font::~Am_Font(local_58);
          for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 0x40) {
            font_win = *(Am_Drawonable **)((long)&wins_ar->font_win + lVar8);
            update_font_numbers(font_win,false);
            (**(code **)(*(long *)font_win + 0x170))
                      (font_win,&Am_Black,test_string,test_str_len,&test_font,10,iVar6,0,local_38,
                       invert);
            (**(code **)(*(long *)font_win + 0x160))
                      (font_win,&black,&Am_No_Style,10,iVar6,test_string_width,test_string_height,0)
            ;
          }
          iVar6 = iVar6 + test_string_height + 4;
          iVar5 = iVar5 + 1;
          uVar4 = local_40;
          uVar9 = local_48;
        }
      }
    }
  }
  uVar9 = local_50 & 0xffffffff;
  for (lVar7 = 0; uVar9 << 6 != lVar7; lVar7 = lVar7 + 0x40) {
    (**(code **)(**(long **)((long)&wins_ar->font_win + lVar7) + 0xa0))();
  }
  return;
}

Assistant:

void
test_font_variety(wins *wins_ar, int ar_len, Am_Style &bs, bool invert)
{
  // Since family_array and size_array are static, they persists across
  // multiple invocations of the enclosing function.  They will not be
  // reinitialized when the function is invoked a second time.
  static Am_Font_Family_Flag family_array[3] = {Am_FONT_FIXED, Am_FONT_SERIF,
                                                Am_FONT_SANS_SERIF};
  static Am_Font_Size_Flag size_array[4] = {Am_FONT_SMALL, Am_FONT_MEDIUM,
                                            Am_FONT_LARGE, Am_FONT_VERY_LARGE};
  int top = 0;
  test_string = "Egypt";
  test_str_len = 5;
  for (int fam = 0; fam < 3; fam++) {
    for (int size = 1; size < 4; size += 2) {
      for (int it = 0; it < 2; it++) {
        for (int under = 0; under < 2; under++) {
          test_font =
              Am_Font(family_array[fam], false, it, under, size_array[size]);

          for (int i = 0; i < ar_len; i++) {
            Am_Drawonable *font_win = wins_ar[i].font_win;
            update_font_numbers(font_win);

            font_win->Draw_Text(Am_Black, test_string, test_str_len, test_font,
                                10, top, Am_DRAW_COPY, bs, invert);
            font_win->Draw_Rectangle(black, Am_No_Style, 10, top,
                                     test_string_width, test_string_height);
          }
          top = top + test_string_height + 4;
        }
      }
    }
  }
  for (int i = 0; i < ar_len; i++) {
    (wins_ar[i].font_win)->Flush_Output();
  }
}